

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

void M3x3_MulVector(double *v,double (*m) [3],double *product)

{
  double dVar1;
  int i;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double temp [3];
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar1 = 0.0;
    lVar4 = 0;
    pdVar3 = *m;
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar1 = dVar1 + *pdVar3 * v[lVar4];
      pdVar3 = pdVar3 + 3;
    }
    temp[lVar2] = dVar1;
    m = (double (*) [3])((long)m + 8);
  }
  product[2] = temp[2];
  *product = temp[0];
  product[1] = temp[1];
  return;
}

Assistant:

void M3x3_MulVector(const double v[3], const double m[3][3], double product[3])
{
    int i, j;
    double temp[3];

    for (i=0 ; i<3 ; i++)
    {
        temp[i] = 0.0;

        for (j=0 ; j<3 ; j++)
        {
            temp[i] += m[j][i] * v[j];
        }
    }
    memcpy(product, temp, 3*sizeof(double));
}